

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

int Io_MvParseLineNamesMv(Io_MvMod_t *p,char *pLine,int fReset)

{
  Vec_Ptr_t *vTokens_00;
  Vec_Ptr_t *vTokens_01;
  Io_MvMan_t *pIVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  Abc_Obj_t *pFanin;
  int local_6c;
  int i;
  int nLines;
  int nLiterals;
  int nOutputs;
  int nInputs;
  char *pArrow;
  char *pFirst;
  char *pName;
  Abc_Obj_t *pNet;
  Vec_Ptr_t *vTokens2;
  Vec_Ptr_t *vTokens;
  int fReset_local;
  char *pLine_local;
  Io_MvMod_t *p_local;
  
  vTokens_00 = p->pMan->vTokens;
  vTokens_01 = p->pMan->vTokens2;
  if (p->pMan->fBlifMv == 0) {
    __assert_fail("p->pMan->fBlifMv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                  ,0x777,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
  }
  pcVar4 = Io_MvFindArrow(pLine);
  if ((p->pMan->fBlifMv == 0) && (pcVar4 != (char *)0x0)) {
    pIVar1 = p->pMan;
    uVar2 = Io_MvGetLine(p->pMan,pLine);
    sprintf(pIVar1->sError,"Line %d: Multi-output node symbol (->) in binary BLIF file.",
            (ulong)uVar2);
    p_local._4_4_ = 0;
  }
  else {
    Io_MvSplitIntoTokens(vTokens_00,pLine,'\0');
    if (fReset == 0) {
      pcVar5 = (char *)Vec_PtrEntry(vTokens_00,0);
      iVar3 = strcmp(pcVar5,"names");
      if (iVar3 != 0) {
        pcVar5 = (char *)Vec_PtrEntry(vTokens_00,0);
        iVar3 = strcmp(pcVar5,"table");
        if (iVar3 != 0) {
          __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"names\") || !strcmp((char *)Vec_PtrEntry(vTokens,0), \"table\")"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                        ,0x784,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
        }
      }
    }
    else {
      pcVar5 = (char *)Vec_PtrEntry(vTokens_00,0);
      iVar3 = strcmp(pcVar5,"r");
      if (iVar3 != 0) {
        pcVar5 = (char *)Vec_PtrEntry(vTokens_00,0);
        iVar3 = strcmp(pcVar5,"reset");
        if (iVar3 != 0) {
          __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"r\") || !strcmp((char *)Vec_PtrEntry(vTokens,0), \"reset\")"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                        ,0x782,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
        }
      }
    }
    iVar3 = Vec_PtrSize(vTokens_00);
    nLiterals = iVar3 + -2;
    nLines = 1;
    if (pcVar4 != (char *)0x0) {
      local_6c = Vec_PtrSize(vTokens_00);
      for (local_6c = local_6c + -2; 0 < local_6c; local_6c = local_6c + -1) {
        pcVar5 = (char *)Vec_PtrEntry(vTokens_00,local_6c);
        if (pcVar4 < pcVar5) {
          nLiterals = nLiterals + -1;
          nLines = nLines + 1;
        }
      }
    }
    pcVar4 = (char *)Vec_PtrEntryLast(vTokens_00);
    sVar6 = strlen(pcVar4);
    Io_MvSplitIntoTokensMv(vTokens_01,pcVar4 + sVar6);
    pcVar5 = (char *)Vec_PtrEntry(vTokens_01,0);
    if (*pcVar5 == '.') {
      if (pcVar5[1] != 'd') {
        __assert_fail("pFirst[1] == \'d\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                      ,0x797,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
      }
      iVar3 = Vec_PtrSize(vTokens_01);
      i = (iVar3 + -1) - nLines;
    }
    else {
      i = Vec_PtrSize(vTokens_01);
    }
    if (i % (nLiterals + nLines) == 0) {
      if ((nLiterals == 0) && (1 < i / (nLiterals + nLines))) {
        for (local_6c = 0; local_6c < nLines; local_6c = local_6c + 1) {
          iVar3 = Vec_PtrSize(vTokens_00);
          pcVar4 = (char *)Vec_PtrEntry(vTokens_00,(iVar3 - nLines) + local_6c);
          pName = (char *)Abc_NtkFindOrCreateNet(p->pNtk,pcVar4);
          if (fReset != 0) {
            if (p->pResetLatch == (Abc_Obj_t *)0x0) {
              __assert_fail("p->pResetLatch != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                            ,0x7ae,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
            }
            pName = (char *)Io_MvParseAddResetCircuit(p,pcVar4);
          }
          p->pMan->nNDnodes = p->pMan->nNDnodes + 1;
          pFanin = Abc_NtkCreateNodeConst0(p->pNtk);
          Abc_ObjAddFanin((Abc_Obj_t *)pName,pFanin);
        }
        p_local._4_4_ = 1;
      }
      else {
        for (local_6c = 0; local_6c < nLines; local_6c = local_6c + 1) {
          iVar3 = Io_MvParseLineNamesMvOne(p,vTokens_00,vTokens_01,nLiterals,nLines,local_6c,fReset)
          ;
          if (iVar3 == 0) {
            return 0;
          }
        }
        p_local._4_4_ = 1;
      }
    }
    else {
      pIVar1 = p->pMan;
      uVar2 = Io_MvGetLine(p->pMan,pcVar5);
      sprintf(pIVar1->sError,
              "Line %d: Wrong number of literals in the table of node \"%s\". (Spaces inside literals are not allowed.)"
              ,(ulong)uVar2,pcVar4);
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int Io_MvParseLineNamesMv( Io_MvMod_t * p, char * pLine, int fReset )
{
    Vec_Ptr_t * vTokens = p->pMan->vTokens;
    Vec_Ptr_t * vTokens2 = p->pMan->vTokens2;
    Abc_Obj_t * pNet;
    char * pName, * pFirst, * pArrow;
    int nInputs, nOutputs, nLiterals, nLines, i;
    assert( p->pMan->fBlifMv );
    // get the arrow if it is present
    pArrow = Io_MvFindArrow( pLine );
    if ( !p->pMan->fBlifMv && pArrow ) 
    {
        sprintf( p->pMan->sError, "Line %d: Multi-output node symbol (->) in binary BLIF file.", Io_MvGetLine(p->pMan, pLine) );
        return 0;
    }
    // split names line into tokens
    Io_MvSplitIntoTokens( vTokens, pLine, '\0' );
    if ( fReset )
        assert( !strcmp((char *)Vec_PtrEntry(vTokens,0), "r") || !strcmp((char *)Vec_PtrEntry(vTokens,0), "reset") );
    else
        assert( !strcmp((char *)Vec_PtrEntry(vTokens,0), "names") || !strcmp((char *)Vec_PtrEntry(vTokens,0), "table") );
    // find the number of inputs and outputs
    nInputs  = Vec_PtrSize(vTokens) - 2;
    nOutputs = 1;
    if ( pArrow != NULL )
    {
        for ( i = Vec_PtrSize(vTokens) - 2; i >= 1; i-- )
            if ( pArrow < (char*)Vec_PtrEntry(vTokens,i) )
            {
                nInputs--;
                nOutputs++;
            }
    }
    // split table into tokens
    pName = (char *)Vec_PtrEntryLast( vTokens );
    Io_MvSplitIntoTokensMv( vTokens2, pName + strlen(pName) );
    pFirst = (char *)Vec_PtrEntry( vTokens2, 0 );
    if ( pFirst[0] == '.' )
    {
        assert( pFirst[1] == 'd' );
        nLiterals = Vec_PtrSize(vTokens2) - 1 - nOutputs;
    }
    else
        nLiterals = Vec_PtrSize(vTokens2);
    // check the number of lines
    if ( nLiterals % (nInputs + nOutputs) != 0 )
    {
        sprintf( p->pMan->sError, "Line %d: Wrong number of literals in the table of node \"%s\". (Spaces inside literals are not allowed.)", Io_MvGetLine(p->pMan, pFirst), pName );
        return 0;
    }
    // check for the ND table
    nLines = nLiterals / (nInputs + nOutputs);
    if ( nInputs == 0 && nLines > 1 )
    {
        // add the outputs to the PIs
        for ( i = 0; i < nOutputs; i++ )
        {
            pName = (char *)Vec_PtrEntry( vTokens, Vec_PtrSize(vTokens) - nOutputs + i );
            // get the net corresponding to this node
            pNet = Abc_NtkFindOrCreateNet(p->pNtk, pName);
            if ( fReset )
            {
                assert( p->pResetLatch != NULL );
                // construct the reset circuit and get the reset net feeding into it
                pNet = Io_MvParseAddResetCircuit( p, pName );
            }
            // add the new PI node
//            Abc_ObjAddFanin( pNet, Abc_NtkCreatePi(p->pNtk) );
//            fprintf( stdout, "Io_ReadBlifMv(): Adding PI for internal non-deterministic node \"%s\".\n", pName );
            p->pMan->nNDnodes++;
            Abc_ObjAddFanin( pNet, Abc_NtkCreateNodeConst0(p->pNtk) );
        }
        return 1;
    }
    // iterate through the outputs
    for ( i = 0; i < nOutputs; i++ )
    {
        if ( !Io_MvParseLineNamesMvOne( p, vTokens, vTokens2, nInputs, nOutputs, i, fReset ) )
            return 0;
    }
    return 1;
}